

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmMakefile *this_00;
  cmake *pcVar2;
  cmExternalMakefileProjectGenerator *pcVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  uint uVar7;
  ulong uVar8;
  string local_1d8;
  cmListFileBacktrace local_1b8;
  ostringstream w;
  
  (*this->_vptr_cmGlobalGenerator[0x31])();
  ProcessEvaluationFiles(this);
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar8)
    break;
    this->CurrentConfigureMakefile = ppcVar1[uVar8]->Makefile;
    (*ppcVar1[uVar8]->_vptr_cmLocalGenerator[2])();
    this_00 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8]->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&w,"CMAKE_SKIP_INSTALL_RULES",(allocator<char> *)&local_1d8);
    bVar4 = cmMakefile::IsOn(this_00,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
    if (!bVar4) {
      cmLocalGenerator::GenerateInstallRules
                ((this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar8]);
    }
    cmLocalGenerator::GenerateTestFiles
              ((this->LocalGenerators).
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]);
    pcVar2 = this->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&w,"Generating",(allocator<char> *)&local_1d8);
    cmake::UpdateProgress
              (pcVar2,(string *)&w,
               ((float)uVar8 + 1.0) /
               (float)(ulong)((long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
    std::__cxx11::string::~string((string *)&w);
    uVar7 = uVar7 + 1;
  }
  this->CurrentConfigureMakefile = (cmMakefile *)0x0;
  GenerateCPackPropertiesFile(this);
  p_Var5 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
      CheckRuleHashes(this);
      WriteSummary(this);
      pcVar3 = (this->ExtraGenerator)._M_t.
               super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
      if (pcVar3 != (cmExternalMakefileProjectGenerator *)0x0) {
        (*pcVar3->_vptr_cmExternalMakefileProjectGenerator[4])();
      }
      if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x2a,id);
        poVar6 = std::operator<<((ostream *)&w,(string *)&local_1d8);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_1d8);
        std::operator<<((ostream *)&w,"MACOSX_RPATH is not specified for the following targets:\n");
        for (p_Var5 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var5 !=
            &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          poVar6 = std::operator<<((ostream *)&w," ");
          poVar6 = std::operator<<(poVar6,(string *)(p_Var5 + 1));
          std::operator<<(poVar6,"\n");
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1d8,&local_1b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1b8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
      if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x44,id_00);
        poVar6 = std::operator<<((ostream *)&w,(string *)&local_1d8);
        std::operator<<(poVar6,
                        "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                       );
        std::__cxx11::string::~string((string *)&local_1d8);
        for (p_Var5 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var5 !=
            &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          poVar6 = std::operator<<((ostream *)&w," ");
          poVar6 = std::operator<<(poVar6,(string *)(p_Var5 + 1));
          std::operator<<(poVar6,"\n");
        }
        pcVar2 = this->CMakeInstance;
        std::__cxx11::stringbuf::str();
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1b8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_1d8,&local_1b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1b8.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      }
      pcVar2 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&w,"Generating done",(allocator<char> *)&local_1d8);
      cmake::UpdateProgress(pcVar2,(string *)&w,-1.0);
LAB_002a36ac:
      std::__cxx11::string::~string((string *)&w);
      return;
    }
    bVar4 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var5 + 2));
    if (!bVar4) {
      bVar4 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar4) {
        return;
      }
      pcVar2 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&w,"Could not write export file.",(allocator<char> *)&local_1b8);
      local_1d8._M_dataplus._M_p = (pointer)0x0;
      local_1d8._M_string_length = 0;
      cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&w,(cmListFileBacktrace *)&local_1d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1d8._M_string_length);
      goto LAB_002a36ac;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void cmGlobalGenerator::Generate()
{
  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      (static_cast<float>(i) + 1.0f) /
        static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccuredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  this->CMakeInstance->UpdateProgress("Generating done", -1);
}